

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov5.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  Allocator **ppAVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar7;
  ulong uVar4;
  undefined4 uVar8;
  undefined8 uVar5;
  undefined8 uVar6;
  char *pcVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 *puVar12;
  int *piVar13;
  bool bVar14;
  size_t *psVar15;
  char cVar16;
  float *pfVar17;
  size_t sVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  pointer pOVar23;
  uint uVar24;
  int w;
  __m128 t_2;
  int iVar25;
  undefined8 uVar26;
  __m128 t;
  int iVar28;
  undefined1 auVar27 [16];
  float fVar29;
  undefined1 auVar30 [16];
  float fVar31;
  float fVar37;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar32;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  vector<Object,_std::allocator<Object>_> objects8;
  vector<Object,_std::allocator<Object>_> proposals;
  int baseLine;
  Extractor ex;
  undefined1 local_348 [64];
  size_t local_308;
  vector<Object,_std::allocator<Object>_> objects;
  Mat local_2d8;
  undefined1 local_288 [16];
  vector<float,_std::allocator<float>_> areas;
  float norm_vals [3];
  Mat image;
  undefined4 local_200;
  int iStack_1fc;
  Allocator *local_1e8;
  Net yolov5;
  Mat m;
  undefined8 local_88;
  uchar *local_80;
  
  if (argc == 2) {
    pcVar9 = argv[1];
    std::__cxx11::string::string((string *)&yolov5,pcVar9,(allocator *)&image);
    cv::imread((string *)&m,(int)&yolov5);
    if ((Allocator **)yolov5._vptr_Net != &yolov5.opt.blob_allocator) {
      operator_delete(yolov5._vptr_Net);
    }
    cVar16 = cv::Mat::empty();
    if (cVar16 == '\0') {
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&yolov5);
      yolov5.opt.use_vulkan_compute = true;
      ncnn::Net::load_param(&yolov5,"yolov5s_6.0.param");
      ncnn::Net::load_model(&yolov5,"yolov5s_6.0.bin");
      iVar22 = (int)local_88;
      w = (int)((ulong)local_88 >> 0x20);
      if (iVar22 < w) {
        fVar29 = 640.0 / (float)w;
        uVar21 = CONCAT44((int)((float)iVar22 * fVar29),0x280);
      }
      else {
        fVar29 = 640.0 / (float)iVar22;
        uVar21 = CONCAT44(0x280,(int)((float)w * fVar29));
      }
      local_288._8_8_ = 0;
      local_288._0_8_ = uVar21;
      ncnn::Mat::from_pixels_resize
                ((Mat *)&image,local_80,0x10002,w,iVar22,(int)uVar21,(int)(uVar21 >> 0x20),
                 (Allocator *)0x0);
      local_2d8.cstep = 0;
      local_2d8.data._0_4_ = 0;
      local_2d8.data._4_4_ = 0;
      local_2d8.refcount._0_4_ = 0;
      local_2d8.refcount._4_4_ = 0;
      local_2d8.elemsize = 0;
      local_2d8.elempack = 0;
      local_2d8.allocator = (Allocator *)0x0;
      local_2d8.dims = 0;
      local_2d8.w = 0;
      local_2d8.h = 0;
      local_2d8.d = 0;
      local_2d8.c = 0;
      ncnn::Option::Option((Option *)&areas);
      iVar25 = ((local_288._0_4_ + 0x3f) / 0x40) * 0x40 - local_288._0_4_;
      iVar28 = ((local_288._4_4_ + 0x3f) / 0x40) * 0x40 - local_288._4_4_;
      local_288._0_4_ = iVar25 / 2;
      local_288._4_4_ = iVar28 / 2;
      local_288._8_4_ = (int)-local_288._8_4_ / 2;
      local_288._12_4_ = (int)-local_288._12_4_ / 2;
      ncnn::copy_make_border
                ((Mat *)&image,&local_2d8,local_288._4_4_,iVar28 - local_288._4_4_,local_288._0_4_,
                 iVar25 - local_288._0_4_,0,114.0,(Option *)&areas);
      norm_vals[0] = 0.003921569;
      norm_vals[1] = 0.003921569;
      norm_vals[2] = 0.003921569;
      ncnn::Mat::substract_mean_normalize(&local_2d8,(float *)0x0,norm_vals);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"images",&local_2d8);
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Extractor::extract(&ex,"output",(Mat *)&areas,0);
      local_308 = 0;
      local_348._0_4_ = 0;
      local_348._4_4_ = 0;
      local_348._8_4_ = 0;
      local_348._12_4_ = 0;
      local_348._16_8_ = 0;
      local_348._24_4_ = 0;
      local_348._32_8_ = (Allocator *)0x0;
      local_348._40_4_ = 0;
      local_348._44_4_ = 0;
      local_348._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create((Mat *)local_348,6,4,(Allocator *)0x0);
      puVar12 = (undefined8 *)CONCAT44(local_348._4_4_,local_348._0_4_);
      *puVar12 = 0x4150000041200000;
      puVar12[1] = 0x41f0000041800000;
      puVar12[2] = 0x41b8000042040000;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)local_348,8,(Mat *)(ulong)(uint)local_2d8.w,
                         (Mat *)(ulong)(uint)local_2d8.h,0.0,
                         (vector<Object,_std::allocator<Object>_> *)&areas);
      std::vector<Object,std::allocator<Object>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      piVar13 = (int *)CONCAT44(local_348._12_4_,local_348._8_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if ((Allocator *)local_348._32_8_ == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_348._4_4_,local_348._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_348._4_4_,local_348._0_4_));
            }
          }
          else {
            (*(*(_func_int ***)local_348._32_8_)[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if ((*piVar13 == 0) &&
           (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0)) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Extractor::extract(&ex,"376",(Mat *)&areas,0);
      local_308 = 0;
      local_348._0_4_ = 0;
      local_348._4_4_ = 0;
      local_348._8_4_ = 0;
      local_348._12_4_ = 0;
      local_348._16_8_ = 0;
      local_348._24_4_ = 0;
      local_348._32_8_ = (Allocator *)0x0;
      local_348._40_4_ = 0;
      local_348._44_4_ = 0;
      local_348._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create((Mat *)local_348,6,4,(Allocator *)0x0);
      puVar12 = (undefined8 *)CONCAT44(local_348._4_4_,local_348._0_4_);
      *puVar12 = 0x4274000041f00000;
      puVar12[1] = 0x4234000042780000;
      puVar12[2] = 0x42ee0000426c0000;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)local_348,0x10,(Mat *)(ulong)(uint)local_2d8.w,
                         (Mat *)(ulong)(uint)local_2d8.h,0.0,
                         (vector<Object,_std::allocator<Object>_> *)&areas);
      std::vector<Object,std::allocator<Object>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      piVar13 = (int *)CONCAT44(local_348._12_4_,local_348._8_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if ((Allocator *)local_348._32_8_ == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_348._4_4_,local_348._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_348._4_4_,local_348._0_4_));
            }
          }
          else {
            (*(*(_func_int ***)local_348._32_8_)[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if ((*piVar13 == 0) &&
           (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0)) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Extractor::extract(&ex,"401",(Mat *)&areas,0);
      local_308 = 0;
      local_348._0_4_ = 0;
      local_348._4_4_ = 0;
      local_348._8_4_ = 0;
      local_348._12_4_ = 0;
      local_348._16_8_ = 0;
      local_348._24_4_ = 0;
      local_348._32_8_ = (Allocator *)0x0;
      local_348._40_4_ = 0;
      local_348._44_4_ = 0;
      local_348._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create((Mat *)local_348,6,4,(Allocator *)0x0);
      puVar12 = (undefined8 *)CONCAT44(local_348._4_4_,local_348._0_4_);
      *puVar12 = 0x42b4000042e80000;
      puVar12[1] = 0x43460000431c0000;
      puVar12[2] = 0x43a3000043ba8000;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)local_348,0x20,(Mat *)(ulong)(uint)local_2d8.w,
                         (Mat *)(ulong)(uint)local_2d8.h,0.0,
                         (vector<Object,_std::allocator<Object>_> *)&areas);
      std::vector<Object,std::allocator<Object>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      if (objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      piVar13 = (int *)CONCAT44(local_348._12_4_,local_348._8_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if ((Allocator *)local_348._32_8_ == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_348._4_4_,local_348._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_348._4_4_,local_348._0_4_));
            }
          }
          else {
            (*(*(_func_int ***)local_348._32_8_)[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if ((*piVar13 == 0) &&
           (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0)) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      pOVar23 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start !=
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        qsort_descent_inplace
                  (&proposals,0,
                   (int)((ulong)((long)proposals.super__Vector_base<Object,_std::allocator<Object>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)proposals.super__Vector_base<Object,_std::allocator<Object>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555
                   + -1);
        pOVar23 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      local_348._0_4_ = 0;
      local_348._4_4_ = 0;
      local_348._8_4_ = 0;
      local_348._12_4_ = 0;
      local_348._16_8_ = (int *)0x0;
      uVar24 = (int)((long)pOVar23 -
                     (long)proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3) * -0x55555555;
      std::vector<float,_std::allocator<float>_>::vector
                (&areas,(long)(int)uVar24,(allocator_type *)&objects8);
      if (0 < (int)uVar24) {
        pfVar17 = &((proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                     super__Vector_impl_data._M_start)->rect).height;
        uVar21 = 0;
        do {
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar21] = pfVar17[-1] * *pfVar17;
          uVar21 = uVar21 + 1;
          pfVar17 = pfVar17 + 6;
        } while ((uVar24 & 0x7fffffff) != uVar21);
        auVar34._12_4_ = 0;
        auVar34._0_12_ =
             (undefined1  [12])
             objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
             super__Vector_impl_data._4_12_;
        objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data
        ._0_16_ = auVar34 << 0x20;
        iVar25 = 0;
        do {
          uVar20 = (uint)((ulong)(local_348._8_8_ - CONCAT44(local_348._4_4_,local_348._0_4_)) >> 2)
          ;
          if ((int)uVar20 < 1) {
LAB_0013c665:
            if (local_348._8_8_ == local_348._16_8_) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)local_348,(iterator)local_348._8_8_,
                         (int *)&objects8);
            }
            else {
              *(int *)local_348._8_8_ = iVar25;
              local_348._8_8_ = local_348._8_8_ + 4;
            }
          }
          else {
            uVar21._0_4_ = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar25].rect.x;
            uVar21._4_4_ = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar25].rect.y;
            auVar36._8_8_ = 0;
            auVar36._0_8_ = uVar21;
            uVar2 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar25].rect.width;
            uVar7 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar25].rect.height;
            auVar27._0_4_ = (float)uVar2 + (float)(undefined4)uVar21;
            auVar27._4_4_ = (float)uVar7 + (float)uVar21._4_4_;
            auVar27._8_8_ = 0;
            bVar14 = true;
            uVar21 = 0;
            do {
              iVar28 = *(int *)(CONCAT44(local_348._4_4_,local_348._0_4_) + uVar21 * 4);
              uVar4._0_4_ = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar28].rect.x;
              uVar4._4_4_ = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar28].rect.y;
              auVar38._8_8_ = 0;
              auVar38._0_8_ = uVar4;
              uVar3 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar28].rect.width;
              uVar8 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar28].rect.height;
              auVar33._0_4_ = (float)uVar3 + (float)(undefined4)uVar4;
              auVar33._4_4_ = (float)uVar8 + (float)uVar4._4_4_;
              auVar33._8_8_ = 0;
              auVar38 = maxps(auVar38,auVar36);
              auVar34 = minps(auVar33,auVar27);
              fVar31 = auVar34._0_4_ - auVar38._0_4_;
              fVar37 = auVar34._4_4_ - auVar38._4_4_;
              fVar32 = 0.0;
              if (0.0 < fVar37 && 0.0 < fVar31) {
                fVar32 = fVar31 * fVar37;
              }
              if (0.45 < fVar32 / ((areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start[iVar28] +
                                   areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_start[iVar25]) - fVar32)) {
                bVar14 = false;
              }
              uVar21 = uVar21 + 1;
            } while ((uVar20 & 0x7fffffff) != uVar21);
            if (bVar14) goto LAB_0013c665;
          }
          iVar25 = (int)objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_ + 1;
          objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = (float)iVar25;
        } while (iVar25 < (int)uVar24);
      }
      if (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar24 = (uint)((ulong)(local_348._8_8_ - CONCAT44(local_348._4_4_,local_348._0_4_)) >> 2);
      std::vector<Object,_std::allocator<Object>_>::resize(&objects,(long)(int)uVar24);
      if (0 < (int)uVar24) {
        uVar26 = CONCAT44((float)(iVar22 + -1),(float)(w + -1));
        lVar19 = 0;
        uVar21 = 0;
        do {
          iVar22 = *(int *)(CONCAT44(local_348._4_4_,local_348._0_4_) + uVar21 * 4);
          uVar5 = *(undefined8 *)
                   &proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar22].rect.width;
          puVar12 = (undefined8 *)
                    ((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                              super__Vector_impl_data._M_start)->rect).x + lVar19);
          *puVar12 = *(undefined8 *)
                      &proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar22].rect;
          puVar12[1] = uVar5;
          *(undefined8 *)
           ((long)&(objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start)->label + lVar19) =
               *(undefined8 *)
                &proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar22].label;
          uVar5 = *(undefined8 *)
                   ((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                             super__Vector_impl_data._M_start)->rect).x + lVar19);
          uVar6 = *(undefined8 *)
                   ((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                             super__Vector_impl_data._M_start)->rect).width + lVar19);
          fVar31 = (float)uVar5;
          fVar32 = (float)((ulong)uVar5 >> 0x20);
          auVar30._0_4_ = fVar31 - (float)(int)local_288._0_4_;
          auVar30._4_4_ = fVar32 - (float)(int)local_288._4_4_;
          auVar30._8_4_ = 0.0 - (float)(int)local_288._8_4_;
          auVar30._12_4_ = 0.0 - (float)(int)local_288._12_4_;
          auVar10._4_4_ = fVar29;
          auVar10._0_4_ = fVar29;
          auVar10._8_4_ = fVar29;
          auVar10._12_4_ = fVar29;
          auVar34 = divps(auVar30,auVar10);
          auVar35._0_4_ = ((float)uVar6 + fVar31) - (float)(int)local_288._0_4_;
          auVar35._4_4_ = ((float)((ulong)uVar6 >> 0x20) + fVar32) - (float)(int)local_288._4_4_;
          auVar35._8_4_ = 0.0 - (float)(int)local_288._8_4_;
          auVar35._12_4_ = 0.0 - (float)(int)local_288._12_4_;
          auVar11._4_4_ = fVar29;
          auVar11._0_4_ = fVar29;
          auVar11._8_4_ = fVar29;
          auVar11._12_4_ = fVar29;
          auVar36 = divps(auVar35,auVar11);
          auVar39._8_4_ = 0xbf800000;
          auVar39._0_8_ = uVar26;
          auVar39._12_4_ = 0xbf800000;
          auVar34 = minps(auVar39,auVar34);
          auVar34 = maxps(ZEXT816(0),auVar34);
          auVar40._8_4_ = 0xbf800000;
          auVar40._0_8_ = uVar26;
          auVar40._12_4_ = 0xbf800000;
          auVar36 = minps(auVar40,auVar36);
          auVar36 = maxps(ZEXT816(0),auVar36);
          *(long *)((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                             super__Vector_impl_data._M_start)->rect).x + lVar19) = auVar34._0_8_;
          *(ulong *)((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                              super__Vector_impl_data._M_start)->rect).width + lVar19) =
               CONCAT44(auVar36._4_4_ - auVar34._4_4_,auVar36._0_4_ - auVar34._0_4_);
          uVar21 = uVar21 + 1;
          lVar19 = lVar19 + 0x18;
        } while ((uVar24 & 0x7fffffff) != uVar21);
      }
      if ((void *)CONCAT44(local_348._4_4_,local_348._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_348._4_4_,local_348._0_4_));
      }
      if (proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ncnn::Extractor::~Extractor(&ex);
      piVar13 = (int *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_2d8.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_2d8.data._4_4_,local_2d8.data._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_2d8.data._4_4_,local_2d8.data._0_4_));
            }
          }
          else {
            (*(local_2d8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(iStack_1fc,local_200);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_1e8 == (Allocator *)0x0) {
            if (_image != (void *)0x0) {
              free(_image);
            }
          }
          else {
            (*local_1e8->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&yolov5);
      cv::Mat::clone();
      psVar15 = (size_t *)CONCAT44(local_2d8.data._4_4_,local_2d8.data._0_4_);
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar19 = 0;
        uVar21 = 0;
        pOVar23 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          local_288._0_8_ = uVar21;
          local_2d8.data = psVar15;
          fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",
                  (double)*(float *)((long)&pOVar23->prob + lVar19),
                  (double)*(float *)((long)&(pOVar23->rect).x + lVar19),
                  (double)*(float *)((long)&(pOVar23->rect).y + lVar19),
                  (double)*(float *)((long)&(pOVar23->rect).width + lVar19),
                  (double)*(float *)((long)&(pOVar23->rect).height + lVar19),
                  (ulong)*(uint *)((long)&pOVar23->label + lVar19));
          local_2d8.elemsize = 0;
          local_2d8.data._0_4_ = 0x3010000;
          pfVar17 = (float *)((long)&(pOVar23->rect).x + lVar19);
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ = (int)ROUND(pfVar17[1]);
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = (int)ROUND(*pfVar17);
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ = (int)ROUND(pfVar17[2]);
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ = (int)ROUND(pfVar17[3]);
          yolov5._vptr_Net = (_func_int **)0x406fe00000000000;
          yolov5.opt.workspace_allocator = (Allocator *)0x0;
          yolov5.opt.lightmode = false;
          yolov5.opt._1_3_ = 0;
          yolov5.opt.num_threads = 0;
          yolov5.opt.blob_allocator = (Allocator *)0x0;
          local_2d8.refcount = (int *)&image;
          cv::rectangle(&local_2d8,&proposals,&yolov5,1,8,0);
          sprintf((char *)&yolov5,"%s %.1f%%",
                  (double)(*(float *)((long)&pOVar23->prob + lVar19) * 100.0),
                  _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel +
                  *(int *)(
                          _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel
                          + (long)*(int *)((long)&pOVar23->label + lVar19) * 4));
          local_2d8.data = &local_2d8.elemsize;
          sVar18 = strlen((char *)&yolov5);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2d8,&yolov5,(long)&yolov5._vptr_Net + sVar18);
          cv::getTextSize((string *)&ex,(int)&local_2d8,0.5,0,(int *)0x1);
          if ((size_t *)local_2d8.data != &local_2d8.elemsize) {
            operator_delete(local_2d8.data);
          }
          fVar29 = (float)(int)*(float *)((long)&(pOVar23->rect).x + lVar19);
          iVar22 = (int)((*(float *)((long)&(pOVar23->rect).y + lVar19) -
                         (float)ex._vptr_Extractor._4_4_) - 0.0);
          if (iVar22 < 1) {
            iVar22 = 0;
          }
          fVar31 = (float)(iStack_1fc - (int)ex._vptr_Extractor);
          if ((int)ex._vptr_Extractor + (int)fVar29 <= iStack_1fc) {
            fVar31 = fVar29;
          }
          local_348._16_8_ = 0;
          local_348._0_4_ = 0x3010000;
          objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ = iVar22;
          objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = fVar31;
          objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ = (int)ex._vptr_Extractor;
          objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ = ex._vptr_Extractor._4_4_;
          local_2d8.data._0_4_ = 0;
          local_2d8.data._4_4_ = 0x406fe000;
          local_2d8.refcount._0_4_ = 0;
          local_2d8.refcount._4_4_ = 0x406fe000;
          local_2d8.elemsize = 0x406fe00000000000;
          local_2d8.elempack = 0;
          local_2d8._28_4_ = 0;
          local_348._8_8_ = &image;
          cv::rectangle(local_348,&objects8,&local_2d8,0xffffffff,8,0);
          local_348._16_8_ = (int *)0x0;
          local_348._0_4_ = 0x3010000;
          local_2d8.data = &local_2d8.elemsize;
          local_348._8_8_ = &image;
          sVar18 = strlen((char *)&yolov5);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2d8,&yolov5,(long)&yolov5._vptr_Net + sVar18);
          norm_vals[1] = (float)(iVar22 + ex._vptr_Extractor._4_4_);
          norm_vals[0] = fVar31;
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish._0_4_ = 0;
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish._4_4_ = 0;
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          cv::putText(0x3fe0000000000000,local_348,&local_2d8,norm_vals,0,&areas,1,8,0);
          uVar26 = local_288._0_8_;
          psVar15 = (size_t *)local_2d8.data;
          if ((size_t *)local_2d8.data != &local_2d8.elemsize) {
            operator_delete(local_2d8.data);
            psVar15 = (size_t *)local_2d8.data;
          }
          local_2d8.data._4_4_ = (undefined4)((ulong)psVar15 >> 0x20);
          uVar21 = uVar26 + 1;
          lVar19 = lVar19 + 0x18;
          pOVar23 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar21 < (ulong)(((long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      local_2d8.refcount = (int *)&image;
      ppAVar1 = &yolov5.opt.blob_allocator;
      yolov5.opt.blob_allocator =
           (Allocator *)CONCAT26(yolov5.opt.blob_allocator._6_2_,0x6567616d69);
      yolov5.opt.lightmode = true;
      yolov5.opt._1_3_ = 0;
      yolov5.opt.num_threads = 0;
      local_2d8.elemsize = 0;
      local_2d8.data._0_4_ = 0x1010000;
      yolov5._vptr_Net = (_func_int **)ppAVar1;
      cv::imshow((string *)&yolov5,(_InputArray *)&local_2d8);
      if ((Allocator **)yolov5._vptr_Net != ppAVar1) {
        operator_delete(yolov5._vptr_Net);
      }
      cv::waitKey(0);
      cv::Mat::~Mat(&image);
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar22 = 0;
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar9);
      iVar22 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    main_cold_1();
    iVar22 = -1;
  }
  return iVar22;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<Object> objects;
    detect_yolov5(m, objects);

    draw_objects(m, objects);

    return 0;
}